

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

languageDefinition * prvTidytidyTestLanguage(ctmbstr languageCode)

{
  languageDefinition *plVar1;
  int iVar2;
  ctmbstr testCode;
  languageDictionary *testDict;
  languageDefinition *testLang;
  uint i;
  ctmbstr languageCode_local;
  
  testLang._4_4_ = 0;
  while( true ) {
    if ((&PTR_language_en_001f4a70)[testLang._4_4_] == (undefined *)0x0) {
      return (languageDefinition *)0x0;
    }
    plVar1 = (languageDefinition *)(&PTR_language_en_001f4a70)[testLang._4_4_];
    iVar2 = strcmp(plVar1->messages[0].value,languageCode);
    if (iVar2 == 0) break;
    testLang._4_4_ = testLang._4_4_ + 1;
  }
  return plVar1;
}

Assistant:

languageDefinition *TY_(tidyTestLanguage)( ctmbstr languageCode )
{
    uint i;
    languageDefinition *testLang;
    languageDictionary *testDict;
    ctmbstr testCode;
    
    for (i = 0; tidyLanguages.languages[i]; ++i)
    {
        testLang = tidyLanguages.languages[i];
        testDict = &testLang->messages;
        testCode = (*testDict)[0].value;
        
        if ( strcmp(testCode, languageCode) == 0 )
            return testLang;
    }
    
    return NULL;
}